

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkMap.c
# Opt level: O2

If_Man_t * Nwk_ManToIf(Aig_Man_t *p,If_Par_t *pPars,Vec_Ptr_t *vAigToIf)

{
  Aig_Obj_t **ppAVar1;
  Aig_Obj_t *pAVar2;
  uint uVar3;
  int iVar4;
  abctime aVar5;
  abctime aVar6;
  Vec_Int_t *pVVar7;
  If_Man_t *p_00;
  Aig_Obj_t *pObj;
  If_Obj_t *Entry;
  void *pvVar8;
  Aig_Obj_t *pAVar9;
  int iVar10;
  Aig_Obj_t *pAVar11;
  Aig_Man_t *pAVar12;
  int i;
  Vec_Int_t *local_50;
  int *local_40;
  int *local_38;
  
  aVar5 = Abc_Clock();
  i = 0;
  Aig_ManSetRegNum(p,0);
  if (pPars->fPower == 0) {
    local_40 = (int *)0x0;
    local_38 = (int *)0x0;
    pVVar7 = (Vec_Int_t *)0x0;
    local_50 = (Vec_Int_t *)0x0;
  }
  else {
    pAVar12 = p;
    local_50 = Saig_ManComputeSwitchProbs(p,0x30,0x10,0);
    iVar4 = (int)pAVar12;
    if (pPars->fVerbose != 0) {
      Abc_Print(iVar4,"%s =","Computing switching activity");
      aVar6 = Abc_Clock();
      Abc_Print(iVar4,"%9.2f sec\n",(double)(aVar6 - aVar5) / 1000000.0);
    }
    local_38 = local_50->pArray;
    iVar4 = p->vObjs->nSize;
    pVVar7 = (Vec_Int_t *)malloc(0x10);
    iVar10 = 0x10;
    if (0xe < iVar4 - 1U) {
      iVar10 = iVar4;
    }
    pVVar7->nCap = iVar10;
    if (iVar10 == 0) {
      local_40 = (int *)0x0;
    }
    else {
      local_40 = (int *)malloc((long)iVar10 << 2);
    }
    pVVar7->pArray = local_40;
    pVVar7->nSize = iVar4;
    memset(local_40,0,(long)iVar4 << 2);
  }
  p_00 = If_ManStart(pPars);
  p_00->vSwitching = pVVar7;
  do {
    if (p->vObjs->nSize <= i) {
      if (local_50 != (Vec_Int_t *)0x0) {
        free(local_50->pArray);
        free(local_50);
      }
      return p_00;
    }
    pObj = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,i);
    if (pObj != (Aig_Obj_t *)0x0) {
      uVar3 = (uint)*(undefined8 *)&pObj->field_0x18 & 7;
      if (uVar3 == 2) {
        Entry = If_ManCreateCi(p_00);
        if (((ulong)pObj & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                        ,0x143,"int Aig_ObjLevel(Aig_Obj_t *)");
        }
        uVar3 = (uint)(*(ulong *)&pObj->field_0x18 >> 0x13);
        *(uint *)Entry = *(uint *)Entry & 0x1fff | uVar3 & 0xffffe000;
        uVar3 = uVar3 >> 0xd;
        if (p_00->nLevelMax < (int)uVar3) {
          p_00->nLevelMax = uVar3;
        }
      }
      else if (uVar3 == 3) {
        Entry = If_ManCreateCo(p_00,(If_Obj_t *)
                                    ((ulong)((uint)pObj->pFanin0 & 1) ^
                                    *(ulong *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x28)))
        ;
      }
      else if (uVar3 == 5) {
        Entry = If_ManCreateAnd(p_00,(If_Obj_t *)
                                     ((ulong)((uint)pObj->pFanin0 & 1) ^
                                     *(ulong *)(((ulong)pObj->pFanin0 & 0xfffffffffffffffe) + 0x28))
                                ,(If_Obj_t *)
                                 ((ulong)((uint)pObj->pFanin1 & 1) ^
                                 *(ulong *)(((ulong)pObj->pFanin1 & 0xfffffffffffffffe) + 0x28)));
      }
      else {
        iVar4 = Aig_ObjIsConst1(pObj);
        if (iVar4 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMap.c"
                        ,0x9b,"If_Man_t *Nwk_ManToIf(Aig_Man_t *, If_Par_t *, Vec_Ptr_t *)");
        }
        Entry = p_00->pConst1;
      }
      pvVar8 = Vec_PtrEntry(vAigToIf,i);
      if (pvVar8 != (void *)0x0) {
        __assert_fail("Vec_PtrEntry(vAigToIf, i) == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/nwk/nwkMap.c"
                      ,0x9d,"If_Man_t *Nwk_ManToIf(Aig_Man_t *, If_Par_t *, Vec_Ptr_t *)");
      }
      Vec_PtrWriteEntry(vAigToIf,i,Entry);
      (pObj->field_5).pData = Entry;
      if (pVVar7 != (Vec_Int_t *)0x0) {
        local_40[Entry->Id] = local_38[pObj->Id];
      }
      ppAVar1 = p->pEquivs;
      if (((ppAVar1 != (Aig_Obj_t **)0x0) && (ppAVar1[pObj->Id] != (Aig_Obj_t *)0x0)) &&
         (pAVar2 = ppAVar1[pObj->Id], pAVar11 = pObj, (*(uint *)&pObj->field_0x18 & 0xffffffc0) != 0
         )) {
        while (pAVar9 = pAVar2, pAVar9 != (Aig_Obj_t *)0x0) {
          *(anon_union_8_3_a781e0d5_for_Aig_Obj_t__13 *)((long)(pAVar11->field_5).pData + 0x28) =
               pAVar9->field_5;
          pAVar11 = pAVar9;
          pAVar2 = ppAVar1[pAVar9->Id];
        }
        If_ManCreateChoice(p_00,(If_Obj_t *)(pObj->field_5).pData);
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

If_Man_t * Nwk_ManToIf( Aig_Man_t * p, If_Par_t * pPars, Vec_Ptr_t * vAigToIf )
{
    extern Vec_Int_t * Saig_ManComputeSwitchProbs( Aig_Man_t * p, int nFrames, int nPref, int fProbOne );
    Vec_Int_t * vSwitching = NULL, * vSwitching2 = NULL;
    float * pSwitching = NULL, * pSwitching2 = NULL;
    If_Man_t * pIfMan;
    If_Obj_t * pIfObj;
    Aig_Obj_t * pNode, * pFanin, * pPrev;
    int i;
    abctime clk = Abc_Clock();
    // set the number of registers (switch activity will be combinational)
    Aig_ManSetRegNum( p, 0 );
    if ( pPars->fPower )
    {
        vSwitching  = Saig_ManComputeSwitchProbs( p, 48, 16, 0 );
        if ( pPars->fVerbose )
        {
            ABC_PRT( "Computing switching activity", Abc_Clock() - clk );
        }
        pSwitching  = (float *)vSwitching->pArray;
        vSwitching2 = Vec_IntStart( Aig_ManObjNumMax(p) );
        pSwitching2 = (float *)vSwitching2->pArray;
    }
    // start the mapping manager and set its parameters
    pIfMan = If_ManStart( pPars );
    pIfMan->vSwitching = vSwitching2;
    // load the AIG into the mapper
    Aig_ManForEachObj( p, pNode, i )
    {
        if ( Aig_ObjIsAnd(pNode) )
        {
            pIfObj = If_ManCreateAnd( pIfMan, 
                If_NotCond( (If_Obj_t *)Aig_ObjFanin0(pNode)->pData, Aig_ObjFaninC0(pNode) ), 
                If_NotCond( (If_Obj_t *)Aig_ObjFanin1(pNode)->pData, Aig_ObjFaninC1(pNode) ) );
//            printf( "no%d=%d\n ", If_ObjId(pIfObj), If_ObjLevel(pIfObj) );
        }
        else if ( Aig_ObjIsCi(pNode) )
        {
            pIfObj = If_ManCreateCi( pIfMan );
            If_ObjSetLevel( pIfObj, Aig_ObjLevel(pNode) );
//            printf( "pi%d=%d\n ", If_ObjId(pIfObj), If_ObjLevel(pIfObj) );
            if ( pIfMan->nLevelMax < (int)pIfObj->Level )
                pIfMan->nLevelMax = (int)pIfObj->Level;
        }
        else if ( Aig_ObjIsCo(pNode) )
        {
            pIfObj = If_ManCreateCo( pIfMan, If_NotCond( (If_Obj_t *)Aig_ObjFanin0(pNode)->pData, Aig_ObjFaninC0(pNode) ) );
//            printf( "po%d=%d\n ", If_ObjId(pIfObj), If_ObjLevel(pIfObj) );
        }
        else if ( Aig_ObjIsConst1(pNode) )
            pIfObj = If_ManConst1( pIfMan );
        else // add the node to the mapper
            assert( 0 );
        // save the result
        assert( Vec_PtrEntry(vAigToIf, i) == NULL );
        Vec_PtrWriteEntry( vAigToIf, i, pIfObj );
        pNode->pData = pIfObj;
        if ( vSwitching2 )
            pSwitching2[pIfObj->Id] = pSwitching[pNode->Id];            
        // set up the choice node
        if ( Aig_ObjIsChoice( p, pNode ) )
        {
            for ( pPrev = pNode, pFanin = Aig_ObjEquiv(p, pNode); pFanin; pPrev = pFanin, pFanin = Aig_ObjEquiv(p, pFanin) )
                If_ObjSetChoice( (If_Obj_t *)pPrev->pData, (If_Obj_t *)pFanin->pData );
            If_ManCreateChoice( pIfMan, (If_Obj_t *)pNode->pData );
        }
//        assert( If_ObjLevel(pIfObj) == Aig_ObjLevel(pNode) );
    }
    if ( vSwitching )
        Vec_IntFree( vSwitching );
    return pIfMan;
}